

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

void ChangeState(WebPWorker *worker,WebPWorkerStatus new_status)

{
  pthread_mutex_t *__mutex;
  int in_ESI;
  undefined8 *in_RDI;
  WebPWorkerImpl *impl;
  
  __mutex = (pthread_mutex_t *)*in_RDI;
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock(__mutex);
    if (*(int *)(in_RDI + 1) != 0) {
      while (*(int *)(in_RDI + 1) != 1) {
        pthread_cond_wait((pthread_cond_t *)(__mutex + 1),__mutex);
      }
      if (in_ESI != 1) {
        *(int *)(in_RDI + 1) = in_ESI;
        pthread_mutex_unlock(__mutex);
        pthread_cond_signal((pthread_cond_t *)(__mutex + 1));
        return;
      }
    }
    pthread_mutex_unlock(__mutex);
  }
  return;
}

Assistant:

static void ChangeState(WebPIDecoder* const idec, DecState new_state,
                        size_t consumed_bytes) {
  MemBuffer* const mem = &idec->mem_;
  idec->state_ = new_state;
  mem->start_ += consumed_bytes;
  assert(mem->start_ <= mem->end_);
  idec->io_.data = mem->buf_ + mem->start_;
  idec->io_.data_size = MemDataSize(mem);
}